

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O2

char * al_get_path_basename(ALLEGRO_PATH *path)

{
  ALLEGRO_USTR *us;
  int end_pos;
  size_t sVar1;
  char *pcVar2;
  ALLEGRO_USTR **ppAVar3;
  
  us = path->filename;
  sVar1 = al_ustr_size(us);
  end_pos = al_ustr_rfind_chr(us,(int)sVar1,0x2e);
  if (end_pos < 0) {
    ppAVar3 = &path->filename;
  }
  else {
    ppAVar3 = &path->basename;
    al_ustr_assign_substr(path->basename,path->filename,0,end_pos);
  }
  pcVar2 = al_cstr(*ppAVar3);
  return pcVar2;
}

Assistant:

const char *al_get_path_basename(const ALLEGRO_PATH *path)
{
   int dot;
   ASSERT(path);

   dot = al_ustr_rfind_chr(path->filename, al_ustr_size(path->filename), '.');
   if (dot >= 0) {
      al_ustr_assign_substr(path->basename, path->filename, 0, dot);
      return al_cstr(path->basename);
   }

   return al_cstr(path->filename);
}